

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_5::ParallelNodeHashMap_IteratesMsan_Test::TestBody
          (ParallelNodeHashMap_IteratesMsan_Test *this)

{
  slot_type *pptVar1;
  pair<const_int,_phmap::priv::(anonymous_namespace)::balast> *x;
  uint uVar2;
  byte bVar3;
  ostream oVar4;
  pointer __first;
  anon_union_8_1_a8a14541_for_iterator_1 aVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  slot_type ptVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  AssertionResult *other;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  pointer __result;
  pointer ppVar16;
  int iVar17;
  _Tp_alloc_type *__alloc;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_00;
  type_info *type;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *ppVar18;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_01;
  allocator_type *__a;
  ulong uVar19;
  size_t sVar20;
  char *message;
  uint uVar21;
  int *key;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *this_00;
  __m128i match;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
  garbage;
  AssertionResult gtest_ar;
  string local_870;
  iterator __begin4;
  Matcher<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&> matcher;
  string local_808;
  StringMatchResultListener inner_listener;
  StringMatchResultListener listener;
  stringstream ss;
  ostream local_4a8 [376];
  ThisMap<int,_balast> t;
  ostream oVar24;
  ostream oVar26;
  ostream oVar27;
  ostream oVar28;
  
  garbage.
  super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  garbage.
  super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  garbage.
  super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __a = (allocator_type *)0x0;
  iVar17 = 0;
  do {
    if (iVar17 == 100) {
      std::
      vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ::~vector(&garbage);
      return;
    }
    std::
    array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>::Inner,_16UL>
    ::array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>::Inner,_16UL>
             *)&t);
    ppVar18 = extraout_RDX;
    for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
      sVar20 = SUB168(ZEXT416(uVar9) * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(ZEXT416(uVar9) * ZEXT816(0xde5fb9d2630458e9),0);
      uVar8 = ((uint)(sVar20 >> 0x18) & 0xff ^
              (uint)(sVar20 >> 8) & 0xffffff ^ (uint)(sVar20 >> 0x10) & 0xffff) & 0xf;
      this_00 = &t.
                 super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                 .
                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                 .sets_._M_elems[uVar8].set_;
      raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
      ::probe((probe_seq<16UL> *)&inner_listener,this_00,sVar20);
      bVar3 = (byte)sVar20;
      auVar22 = ZEXT216(CONCAT11(bVar3,bVar3) & 0x7f7f);
      auVar22 = pshuflw(auVar22,auVar22,0);
      while( true ) {
        poVar12 = inner_listener.super_MatchResultListener.stream_ + (long)this_00->ctrl_;
        oVar4 = poVar12[0xf];
        oVar24 = auVar22[0];
        auVar25[0] = -(oVar24 == *poVar12);
        oVar26 = auVar22[1];
        auVar25[1] = -(oVar26 == poVar12[1]);
        oVar27 = auVar22[2];
        auVar25[2] = -(oVar27 == poVar12[2]);
        oVar28 = auVar22[3];
        auVar25[3] = -(oVar28 == poVar12[3]);
        auVar25[4] = -(oVar24 == poVar12[4]);
        auVar25[5] = -(oVar26 == poVar12[5]);
        auVar25[6] = -(oVar27 == poVar12[6]);
        auVar25[7] = -(oVar28 == poVar12[7]);
        auVar25[8] = -(oVar24 == poVar12[8]);
        auVar25[9] = -(oVar26 == poVar12[9]);
        auVar25[10] = -(oVar27 == poVar12[10]);
        auVar25[0xb] = -(oVar28 == poVar12[0xb]);
        auVar25[0xc] = -(oVar24 == poVar12[0xc]);
        auVar25[0xd] = -(oVar26 == poVar12[0xd]);
        auVar25[0xe] = -(oVar27 == poVar12[0xe]);
        auVar25[0xf] = -(oVar28 == oVar4);
        for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar25[0xf] >> 7) << 0xf); uVar21 != 0;
            uVar21 = uVar21 - 1 & uVar21) {
          uVar2 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          if (t.
              super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
              .
              super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
              .sets_._M_elems[uVar8].set_.slots_
              [(ulong)(inner_listener.super_MatchResultListener.stream_ + uVar2) &
               (ulong)inner_listener.super_MatchResultListener._vptr_MatchResultListener]->first ==
              uVar9) {
            if (((ulong)(inner_listener.super_MatchResultListener.stream_ + uVar2) &
                (ulong)inner_listener.super_MatchResultListener._vptr_MatchResultListener) !=
                0xffffffffffffffff) goto LAB_00130ae8;
            goto LAB_00130aa8;
          }
        }
        auVar23[0] = -(*poVar12 == (ostream)0x80);
        auVar23[1] = -(poVar12[1] == (ostream)0x80);
        auVar23[2] = -(poVar12[2] == (ostream)0x80);
        auVar23[3] = -(poVar12[3] == (ostream)0x80);
        auVar23[4] = -(poVar12[4] == (ostream)0x80);
        auVar23[5] = -(poVar12[5] == (ostream)0x80);
        auVar23[6] = -(poVar12[6] == (ostream)0x80);
        auVar23[7] = -(poVar12[7] == (ostream)0x80);
        auVar23[8] = -(poVar12[8] == (ostream)0x80);
        auVar23[9] = -(poVar12[9] == (ostream)0x80);
        auVar23[10] = -(poVar12[10] == (ostream)0x80);
        auVar23[0xb] = -(poVar12[0xb] == (ostream)0x80);
        auVar23[0xc] = -(poVar12[0xc] == (ostream)0x80);
        auVar23[0xd] = -(poVar12[0xd] == (ostream)0x80);
        auVar23[0xe] = -(poVar12[0xe] == (ostream)0x80);
        auVar23[0xf] = -(oVar4 == (ostream)0x80);
        if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar23 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar23 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar23 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            oVar4 == (ostream)0x80) break;
        lVar13 = inner_listener._16_8_ + 0x10;
        inner_listener._16_8_ = inner_listener._16_8_ + 0x10;
        inner_listener.super_MatchResultListener.stream_ =
             (ostream *)
             ((ulong)(inner_listener.super_MatchResultListener.stream_ + lVar13) &
             (ulong)inner_listener.super_MatchResultListener._vptr_MatchResultListener);
      }
LAB_00130aa8:
      sVar20 = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               ::prepare_insert(this_00,sVar20);
      pptVar1 = t.
                super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                .
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                .sets_._M_elems[uVar8].set_.slots_;
      ptVar10 = (slot_type)operator_new(8);
      ptVar10->first = uVar9;
      pptVar1[sVar20] = ptVar10;
      raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
      ::set_ctrl(this_00,sVar20,bVar3 & 0x7f);
LAB_00130ae8:
      __begin4.it_ = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                     ::begin((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                              *)&t);
      __begin4.inner_end_ = (Inner *)&stack0xffffffffffffffd0;
      __begin4.it_end_.ctrl_ =
           t.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.ctrl_ +
           t.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.capacity_;
      __begin4.inner_ = (Inner *)&t;
      while (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
             ::iterator::skip_empty(&__begin4), __begin4.inner_ != (Inner *)0x0) {
        aVar5 = __begin4.it_.field_1;
        x = *__begin4.it_.field_1.slot_;
        puVar11 = (undefined8 *)operator_new(0x38);
        *puVar11 = &PTR__PairMatcherImpl_002d3050;
        puVar11[3] = 0;
        puVar11[2] = testing::internal::MatcherBase<int_const&>::
                     GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                     ::kVTable;
        puVar11[1] = &PTR__MatcherBase_002d3b38;
        puVar11[6] = 0;
        puVar11[5] = testing::internal::
                     MatcherBase<phmap::priv::(anonymous_namespace)::balast_const&>::
                     GetVTable<testing::internal::MatcherBase<phmap::priv::(anonymous_namespace)::balast_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                     ::kVTable;
        puVar11[4] = &PTR__MatcherBase_002d30b8;
        matcher.
        super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>.
        vtable_ = (VTable *)
                  testing::internal::
                  MatcherBase<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>const&>
                  ::
                  GetVTable<testing::internal::MatcherBase<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>const&>::ValuePolicy<testing::MatcherInterface<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>const&>const*,true>>()
                  ::kVTable;
        matcher.
        super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>.
        buffer_.ptr = operator_new(0x10);
        ((matcher.
          super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
          .buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
        *(undefined8 **)
         (matcher.
          super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
          .buffer_.i + 8) = puVar11;
        matcher.
        super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>.
        super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherBase_002d3178;
        bVar6 = testing::internal::
                MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                ::Matches(&matcher.
                           super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                          ,x);
        if (bVar6) {
          testing::AssertionSuccess();
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar12 = std::operator<<(local_4a8,"Value of: ");
          poVar12 = std::operator<<(poVar12,"p");
          poVar12 = std::operator<<(poVar12,"\n");
          std::operator<<(poVar12,"Expected: ");
          testing::internal::
          MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>::
          DescribeTo(&matcher.
                      super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                     ,local_4a8);
          testing::StringMatchResultListener::StringMatchResultListener(&listener);
          if (listener.super_MatchResultListener.stream_ == (ostream *)0x0) {
            bVar6 = testing::internal::
                    MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                    ::Matches(&matcher.
                               super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                              ,x);
            if (bVar6) goto LAB_00130d75;
          }
          else {
            testing::StringMatchResultListener::StringMatchResultListener(&inner_listener);
            bVar6 = testing::internal::
                    MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                    ::MatchAndExplain(&matcher.
                                       super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                                      ,x,&inner_listener.super_MatchResultListener);
            poVar12 = listener.super_MatchResultListener.stream_;
            std::operator<<(listener.super_MatchResultListener.stream_,'(');
            ((void)((*{parm#2})<<{parm#1}))testing::internal::
            internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
            PrintValue<int,void>(&x->first,poVar12);
            std::operator<<(poVar12,", ");
            testing::internal::PrintBytesInObjectTo(&x->field_0x4,1,poVar12);
            std::operator<<(poVar12,')');
            testing::internal::GetTypeName_abi_cxx11_
                      (&local_870,
                       (internal *)
                       &std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>::typeinfo,
                       type);
            bVar7 = testing::internal::IsReadableTypeName(&local_870);
            if (bVar7) {
              poVar12 = std::operator<<(listener.super_MatchResultListener.stream_," (of type ");
              poVar12 = std::operator<<(poVar12,(string *)&local_870);
              std::operator<<(poVar12,")");
            }
            std::__cxx11::stringbuf::str();
            testing::internal::PrintIfNotEmpty
                      (&local_808,listener.super_MatchResultListener.stream_);
            std::__cxx11::string::~string((string *)&local_808);
            std::__cxx11::string::~string((string *)&local_870);
            testing::StringMatchResultListener::~StringMatchResultListener(&inner_listener);
            if (bVar6) {
LAB_00130d75:
              std::operator<<(local_4a8,
                              "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                             );
            }
          }
          poVar12 = std::operator<<(local_4a8,"\n  Actual: ");
          std::__cxx11::stringbuf::str();
          std::operator<<(poVar12,(string *)&inner_listener);
          std::__cxx11::string::~string((string *)&inner_listener);
          testing::AssertionFailure();
          std::__cxx11::stringbuf::str();
          other = testing::AssertionResult::operator<<
                            ((AssertionResult *)&local_870,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &inner_listener);
          testing::AssertionResult::AssertionResult(&gtest_ar,other);
          std::__cxx11::string::~string((string *)&inner_listener);
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_870._M_string_length);
          testing::StringMatchResultListener::~StringMatchResultListener(&listener);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        }
        testing::internal::
        MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>::
        ~MatcherBase(&matcher.
                      super_MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                    );
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&inner_listener);
          message = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            message = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&listener,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/flat_hash_map_test.cc"
                     ,0x86,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&listener,(Message *)&inner_listener);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&listener);
          if (inner_listener.super_MatchResultListener._vptr_MatchResultListener !=
              (_func_int **)0x0) {
            (**(code **)(*inner_listener.super_MatchResultListener._vptr_MatchResultListener + 8))()
            ;
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        __begin4.it_.field_1.slot_ = aVar5.slot_ + 1;
        __begin4.it_.ctrl_ = __begin4.it_.ctrl_ + 1;
        raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
        ::iterator::skip_empty_or_deleted(&__begin4.it_);
      }
      ppVar18 = extraout_RDX_00;
    }
    if (__a == (allocator_type *)
               garbage.
               super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __first = garbage.
                super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)__a -
               (long)garbage.
                     super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar13 == 0x7ffffffffffffe00) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar14 = lVar13 / 0x300;
      ppVar18 = (parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
                 *)(lVar13 % 0x300);
      uVar15 = uVar14;
      if (__a == (allocator_type *)
                 garbage.
                 super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
        uVar15 = 1;
      }
      uVar19 = uVar15 + uVar14;
      __alloc = (_Tp_alloc_type *)0x2aaaaaaaaaaaaa;
      if (0x2aaaaaaaaaaaa9 < uVar19) {
        uVar19 = 0x2aaaaaaaaaaaaa;
      }
      if (CARRY8(uVar15,uVar14)) {
        uVar19 = 0x2aaaaaaaaaaaaa;
      }
      if (uVar19 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar19 * 0x300);
        ppVar18 = extraout_RDX_01;
      }
      std::
      allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
      ::
      construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                ((allocator_type *)(__result + uVar14),&t,ppVar18);
      ppVar16 = std::
                vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                ::_S_relocate(__first,(pointer)__a,__result,__alloc);
      __a = (allocator_type *)
            std::
            vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
            ::_S_relocate((pointer)__a,(pointer)__a,ppVar16 + 1,(_Tp_alloc_type *)0x300);
      std::
      _Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ::_M_deallocate((_Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                       *)__first,
                      (pointer)(((long)garbage.
                                       super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__first) / 0x300),
                      ((long)garbage.
                             super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first) %
                      0x300);
      garbage.
      super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)__a;
      garbage.
      super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      garbage.
      super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar19;
    }
    else {
      std::
      allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
      ::
      construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                (__a,&t,ppVar18);
      __a = __a + 0x300;
      garbage.
      super__Vector_base<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)__a;
    }
    std::
    array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>::Inner,_16UL>
    ::~array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>::Inner,_16UL>
              *)&t);
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

bool operator==(const Int& other) const { return value == other.value; }